

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

void * __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
::consume_operation::element_ptr(consume_operation *this)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar2 < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
               ,0x47d);
    uVar2 = *(ulong *)(this + 0x10);
  }
  pvVar1 = detail::
           LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::get_element(*(LfQueueControl **)(this + 8),SUB41(((uint)uVar2 & 4) >> 2,0));
  return pvVar1;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return Base::get_element(m_consume_data.m_control, m_consume_data.external());
            }